

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O2

int slots_required(int skill)

{
  int iVar1;
  
  iVar1 = (int)u.weapon_skills[skill].skill;
  if (skill != 0x26 && 0x1d < skill) {
    iVar1 = (int)(short)((int)((uint)(ushort)((short)(iVar1 + 1U) >> 0xf) << 0x10 |
                              iVar1 + 1U & 0xffff) / 2);
  }
  return iVar1;
}

Assistant:

static int slots_required(int skill)
{
    int tmp = P_SKILL(skill);

    /* The more difficult the training, the more slots it takes.
     *	unskilled -> basic	1
     *	basic -> skilled	2
     *	skilled -> expert	3
     */
    if (skill <= P_LAST_WEAPON || skill == P_TWO_WEAPON_COMBAT)
	return tmp;

    /* Fewer slots used up for unarmed or martial.
     *	unskilled -> basic	1
     *	basic -> skilled	1
     *	skilled -> expert	2
     *	expert -> master	2
     *	master -> grand master	3
     */
    return (tmp + 1) / 2;
}